

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O2

void __thiscall DeckBuilder::~DeckBuilder(DeckBuilder *this)

{
  _List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *this_00;
  _List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *this_01;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var1 = (_List_node_base *)this->black;
  p_Var2 = p_Var1;
  while (p_Var1 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var1 != p_Var2) {
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)p_Var2,(char *)(p_Var1 + 1));
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 0x18))();
    }
    p_Var2 = (_List_node_base *)this->black;
    p_Var1 = p_Var2->_M_next;
  }
  p_Var1 = (_List_node_base *)this->green;
  p_Var2 = p_Var1;
  while (p_Var1 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var1 != p_Var2) {
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)p_Var2,(char *)(p_Var1 + 1));
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 0x18))();
    }
    p_Var2 = (_List_node_base *)this->green;
    p_Var1 = p_Var2->_M_next;
  }
  this_00 = &this->black->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>;
  if (this_00 != (_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)0x0) {
    std::__cxx11::_List_base<BlackCard_*,_std::allocator<BlackCard_*>_>::_M_clear(this_00);
  }
  operator_delete(this_00,0x18);
  this_01 = &this->green->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>;
  if (this_01 != (_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)0x0) {
    std::__cxx11::_List_base<GreenCard_*,_std::allocator<GreenCard_*>_>::_M_clear(this_01);
  }
  operator_delete(this_01,0x18);
  return;
}

Assistant:

DeckBuilder::~DeckBuilder()
{
	list<BlackCard *>::iterator it;
	list<GreenCard *>::iterator it2;

	for (it = black->begin(); it != black->end(); it++)
	{
		black->remove((*it));
		delete *it;
		it = black->begin();
	}
	for (it2 = green->begin(); it2 != green->end(); it2++)
	{
		green->remove((*it2));
		delete *it2;
		it2 = green->begin();
	}
	delete black;
	delete green;
}